

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O1

bool __thiscall
webrtc::TraceImpl::CreateFileName
          (TraceImpl *this,char *file_name_utf8,char *file_name_with_counter_utf8,uint32_t new_count
          )

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  
  sVar4 = strlen(file_name_utf8);
  uVar6 = (uint)sVar4;
  if (-1 < (int)uVar6) {
    uVar3 = 1;
    if ((int)uVar6 < 1) {
      uVar3 = uVar6;
    }
    uVar3 = uVar3 - 1;
    uVar5 = (ulong)(uVar6 & 0x7fffffff);
    do {
      if ((long)uVar5 < 2) goto LAB_0018ed62;
      uVar1 = uVar5 - 1;
      lVar2 = uVar5 - 1;
      uVar5 = uVar1;
    } while (file_name_utf8[lVar2] != '.');
    uVar3 = (uint)uVar1;
LAB_0018ed62:
    if (uVar3 == 0) {
      uVar3 = uVar6;
    }
    sVar4 = (size_t)(int)uVar3;
    memcpy(file_name_with_counter_utf8,file_name_utf8,sVar4);
    sprintf(file_name_with_counter_utf8 + sVar4,"_%lu%s",(ulong)new_count,file_name_utf8 + sVar4);
  }
  return -1 < (int)uVar6;
}

Assistant:

bool TraceImpl::CreateFileName(
    const char file_name_utf8[FileWrapper::kMaxFileNameSize],
    char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize],
    const uint32_t new_count) const {
  int32_t length = (int32_t)strlen(file_name_utf8);
  if (length < 0) {
    return false;
  }

  int32_t length_without_file_ending = length - 1;
  while (length_without_file_ending > 0) {
    if (file_name_utf8[length_without_file_ending] == '.') {
      break;
    } else {
      length_without_file_ending--;
    }
  }
  if (length_without_file_ending == 0) {
    length_without_file_ending = length;
  }
  memcpy(file_name_with_counter_utf8, file_name_utf8,
         length_without_file_ending);
  sprintf(file_name_with_counter_utf8 + length_without_file_ending, "_%lu%s",
          static_cast<long unsigned int>(new_count),
          file_name_utf8 + length_without_file_ending);
  return true;
}